

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O2

QSizeF * __thiscall
QGraphicsLayoutItemPrivate::effectiveSizeHints(QGraphicsLayoutItemPrivate *this,QSizeF *constraint)

{
  QSizeF *size;
  QSizeF *result;
  qreal *preferred;
  qreal *maximum;
  qreal *pqVar1;
  QGraphicsLayoutItem *pQVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  QSizeF *size_00;
  long in_FS_OFFSET;
  qreal extraout_XMM0_Qa;
  double dVar7;
  qreal extraout_XMM0_Qa_00;
  qreal extraout_XMM0_Qa_01;
  double dVar8;
  qreal qVar9;
  double dVar10;
  QSizeF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = this->q_ptr;
  bVar3 = constraint->wd < 0.0;
  bVar4 = constraint->ht < 0.0;
  if (bVar4 && bVar3) {
    size_00 = this->cachedSizeHints;
    if ((this->field_0xb0 & 1) == 0) goto LAB_0058b680;
  }
  else {
    if (((this->field_0xb0 & 2) == 0) &&
       (bVar5 = qFuzzyCompare(constraint,&this->cachedConstraint), bVar5)) {
      size_00 = this->cachedSizeHintsWithConstraints;
      goto LAB_0058b680;
    }
    size_00 = this->cachedSizeHintsWithConstraints;
  }
  for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 0x10) {
    qVar9 = constraint->ht;
    pqVar1 = (qreal *)((long)&size_00->wd + lVar6);
    *pqVar1 = constraint->wd;
    pqVar1[1] = qVar9;
    if (this->userSizeHints != (QSizeF *)0x0) {
      combineSize((QSizeF *)((long)&size_00->wd + lVar6),
                  (QSizeF *)((long)&this->userSizeHints->wd + lVar6));
    }
  }
  size = size_00 + 1;
  result = size_00 + 2;
  normalizeHints(&size_00->wd,&size->wd,&result->wd,&size_00[3].wd);
  pqVar1 = &size_00->ht;
  preferred = &size_00[1].ht;
  maximum = &size_00[2].ht;
  normalizeHints(pqVar1,preferred,maximum,&size_00[3].ht);
  dVar8 = 0.0;
  if ((size_00[2].wd <= 0.0 && size_00[2].wd != 0.0) || (dVar7 = *maximum, dVar7 < 0.0)) {
    (*pQVar2->_vptr_QGraphicsLayoutItem[6])(pQVar2,2,result);
    dVar10 = result->wd;
    if (dVar10 < 0.0) {
      result->wd = extraout_XMM0_Qa;
      dVar10 = extraout_XMM0_Qa;
    }
    dVar7 = *maximum;
    if (*maximum < 0.0) {
      *maximum = dVar8;
      dVar7 = dVar8;
    }
    if (dVar10 < 0.0) {
      result->wd = 16777215.0;
    }
  }
  qVar9 = 0.0;
  if (dVar7 < 0.0) {
    *maximum = 16777215.0;
  }
  expandSize(result,size);
  expandSize(result,size_00);
  local_48.wd = 16777215.0;
  local_48.ht = 16777215.0;
  boundSize(result,&local_48);
  if ((size_00->wd <= 0.0 && size_00->wd != 0.0) || (*pqVar1 <= 0.0 && *pqVar1 != 0.0)) {
    (*pQVar2->_vptr_QGraphicsLayoutItem[6])(pQVar2,0,size_00);
    if (size_00->wd <= 0.0 && size_00->wd != 0.0) {
      size_00->wd = extraout_XMM0_Qa_00;
    }
    if (*pqVar1 <= 0.0 && *pqVar1 != 0.0) {
      *pqVar1 = qVar9;
    }
  }
  local_48.wd = 0.0;
  local_48.ht = 0.0;
  expandSize(size_00,&local_48);
  boundSize(size_00,size);
  boundSize(size_00,result);
  if ((size_00[1].wd <= 0.0 && size_00[1].wd != 0.0) || (*preferred <= 0.0 && *preferred != 0.0)) {
    (*pQVar2->_vptr_QGraphicsLayoutItem[6])(pQVar2,1,size);
    if (size->wd <= 0.0 && size->wd != 0.0) {
      size->wd = extraout_XMM0_Qa_01;
    }
    if (*preferred <= 0.0 && *preferred != 0.0) {
      *preferred = qVar9;
    }
  }
  expandSize(size,size_00);
  boundSize(size,result);
  if (bVar4 && bVar3) {
    this->field_0xb0 = this->field_0xb0 & 0xfe;
  }
  else {
    qVar9 = constraint->ht;
    (this->cachedConstraint).wd = constraint->wd;
    (this->cachedConstraint).ht = qVar9;
    this->field_0xb0 = this->field_0xb0 & 0xfd;
  }
LAB_0058b680:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return size_00;
}

Assistant:

QSizeF *QGraphicsLayoutItemPrivate::effectiveSizeHints(const QSizeF &constraint) const
{
    Q_Q(const QGraphicsLayoutItem);
    QSizeF *sizeHintCache;
    const bool hasConstraint = constraint.width() >= 0 || constraint.height() >= 0;
    if (hasConstraint) {
        if (!sizeHintWithConstraintCacheDirty && constraint == cachedConstraint)
            return cachedSizeHintsWithConstraints;
        sizeHintCache = cachedSizeHintsWithConstraints;
    } else {
        if (!sizeHintCacheDirty)
            return cachedSizeHints;
        sizeHintCache = cachedSizeHints;
    }

    for (int i = 0; i < Qt::NSizeHints; ++i) {
        sizeHintCache[i] = constraint;
        if (userSizeHints)
            combineSize(sizeHintCache[i], userSizeHints[i]);
    }

    QSizeF &minS = sizeHintCache[Qt::MinimumSize];
    QSizeF &prefS = sizeHintCache[Qt::PreferredSize];
    QSizeF &maxS = sizeHintCache[Qt::MaximumSize];
    QSizeF &descentS = sizeHintCache[Qt::MinimumDescent];

    normalizeHints(minS.rwidth(), prefS.rwidth(), maxS.rwidth(), descentS.rwidth());
    normalizeHints(minS.rheight(), prefS.rheight(), maxS.rheight(), descentS.rheight());

    // if the minimum, preferred and maximum sizes contradict each other
    // (e.g. the minimum is larger than the maximum) we give priority to
    // the maximum size, then the minimum size and finally the preferred size
    COMBINE_SIZE(maxS, q->sizeHint(Qt::MaximumSize, maxS));
    combineSize(maxS, QSizeF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX));
    expandSize(maxS, prefS);
    expandSize(maxS, minS);
    boundSize(maxS, QSizeF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX));

    COMBINE_SIZE(minS, q->sizeHint(Qt::MinimumSize, minS));
    expandSize(minS, QSizeF(0, 0));
    boundSize(minS, prefS);
    boundSize(minS, maxS);

    COMBINE_SIZE(prefS, q->sizeHint(Qt::PreferredSize, prefS));
    expandSize(prefS, minS);
    boundSize(prefS, maxS);

    // Not supported yet
    // COMBINE_SIZE(descentS, q->sizeHint(Qt::MinimumDescent, constraint));

    if (hasConstraint) {
        cachedConstraint = constraint;
        sizeHintWithConstraintCacheDirty = false;
    } else {
        sizeHintCacheDirty = false;
    }
    return sizeHintCache;
}